

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O3

void __thiscall wasm::StringLifting::run(StringLifting *this,Module *module)

{
  byte *pbVar1;
  int iVar2;
  pointer puVar3;
  Global *pGVar4;
  char *pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar6;
  pointer puVar7;
  Function *pFVar8;
  undefined1 __nptr [8];
  bool bVar9;
  string_view *psVar10;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  _Var11;
  int *piVar12;
  ulong uVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  iterator iVar17;
  string *defaultValue;
  char *pcVar18;
  undefined8 extraout_RDX;
  undefined8 uVar19;
  pointer puVar20;
  pointer puVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  string_view sVar27;
  string_view sVar28;
  Name name;
  string_view s;
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  Array local_420;
  HeapType local_410;
  undefined1 local_408 [8];
  vector<char,_std::allocator<char>_> copy;
  Type local_280;
  Type local_278;
  Type local_270;
  Type local_268;
  Type local_260;
  Type local_258;
  Type local_250;
  CustomSection *local_248;
  CustomSection *local_240;
  CustomSection *local_238;
  CustomSection *local_230;
  CustomSection *local_228;
  CustomSection *local_220;
  undefined1 local_218 [8];
  StringApplier applier;
  pointer local_90;
  uint local_84;
  iterator local_80;
  undefined1 auStack_78 [8];
  Name wtf8;
  
  copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_408;
  local_408 = (undefined1  [8])
              &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"string-constants-module","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_78,WasmStringConstsModule,(allocator<char> *)&local_90);
  defaultValue = (string *)auStack_78;
  Pass::getArgumentOrDefault((string *)local_218,&this->super_Pass,(string *)local_408,defaultValue)
  ;
  sVar27._M_str = (char *)0x0;
  sVar27._M_len = (size_t)local_218;
  sVar27 = IString::interned((IString *)
                             applier.
                             super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                             .super_Pass._vptr_Pass,sVar27,SUB81(defaultValue,0));
  if (local_218 !=
      (undefined1  [8])
      &applier.
       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
       super_Pass.runner) {
    operator_delete((void *)local_218,
                    (ulong)((long)&(applier.
                                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                    .super_Pass.runner)->_vptr_PassRunner + 1));
  }
  if (auStack_78 != (undefined1  [8])&wtf8.super_IString.str._M_str) {
    operator_delete((void *)auStack_78,(ulong)(wtf8.super_IString.str._M_str + 1));
  }
  if (local_408 !=
      (undefined1  [8])
      &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((void *)local_408,
                    (ulong)(copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1));
  }
  puVar20 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 == puVar3) {
    local_84 = 0;
  }
  else {
    uVar19 = 0;
    do {
      pGVar4 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      defaultValue = *(string **)((long)&(pGVar4->super_Importable).module + 8);
      if ((defaultValue != (string *)0x0) && (defaultValue == (string *)sVar27._M_str)) {
        auStack_78 = *(undefined1 (*) [8])&(pGVar4->super_Importable).base.super_IString.str;
        wtf8.super_IString.str._M_len = *(size_t *)((long)&(pGVar4->super_Importable).base + 8);
        std::__cxx11::stringstream::stringstream((stringstream *)local_218);
        sVar28._M_str = (char *)defaultValue;
        sVar28._M_len = wtf8.super_IString.str._M_len;
        bVar9 = String::convertWTF8ToWTF16
                          ((String *)
                           &applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_Pass.runner,(ostream *)auStack_78,sVar28);
        if (!bVar9) {
          Fatal::Fatal((Fatal *)local_408);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish,"Bad string to lift: ",0x14);
          Fatal::operator<<((Fatal *)local_408,(Name *)auStack_78);
          Fatal::~Fatal((Fatal *)local_408);
        }
        std::__cxx11::stringbuf::str();
        s._M_str = (char *)0x0;
        s._M_len = (size_t)local_408;
        sVar28 = IString::interned((IString *)
                                   copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start,s,SUB81(defaultValue,0));
        psVar10 = (string_view *)
                  std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->importedStrings,
                               (key_type *)
                               (puVar20->_M_t).
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        *psVar10 = sVar28;
        if (local_408 !=
            (undefined1  [8])
            &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
          operator_delete((void *)local_408,
                          (ulong)(copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_218);
        std::ios_base::~ios_base
                  ((ios_base *)
                   ((long)applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                          super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                          fixed._M_elems + 0x10));
        uVar19 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      local_84 = (uint)uVar19;
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar3);
  }
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,__gnu_cxx::__ops::_Iter_pred<wasm::StringLifting::run(wasm::Module*)::_lambda(wasm::CustomSection&)_1_>>
                     ((module->customSections).
                      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (module->customSections).
                      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  if (_Var11._M_current !=
      (module->customSections).
      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_408,&(_Var11._M_current)->data);
    auStack_78._0_4_ = 3;
    wtf8.super_IString.str._M_len = 0;
    json::Value::parse((Value *)auStack_78,(char *)local_408,WTF16);
    local_80._M_current = _Var11._M_current;
    if (auStack_78._0_4_ != Array) {
      Fatal::Fatal((Fatal *)local_218);
      Fatal::operator<<((Fatal *)local_218,
                        (char (*) [59])"StringLifting: string.const section should be a JSON array")
      ;
LAB_00a4cbba:
      Fatal::~Fatal((Fatal *)local_218);
    }
    puVar20 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar3) {
      do {
        pGVar4 = (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((*(char **)((long)&(pGVar4->super_Importable).module + 8) != (char *)0x0) &&
           (sVar27 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xe045c4),
                                       SUB81(defaultValue,0)),
           *(char **)((long)&(pGVar4->super_Importable).module + 8) == sVar27._M_str)) {
          pGVar4 = (puVar20->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          pcVar5 = *(char **)((long)&(pGVar4->super_Importable).base + 8);
          local_218 = (undefined1  [8])
                      &applier.
                       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                       .super_Pass.runner;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,pcVar5,
                     pcVar5 + *(long *)&(pGVar4->super_Importable).base.super_IString.str);
          __nptr = local_218;
          piVar12 = __errno_location();
          iVar2 = *piVar12;
          *piVar12 = 0;
          uVar13 = strtol((char *)__nptr,&local_90,10);
          if ((undefined1  [8])local_90 == __nptr) {
            std::__throw_invalid_argument("stoi");
LAB_00a4c842:
            __assert_fail("isArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                          ,0x185,"size_t json::Value::size()");
          }
          if (((long)(int)uVar13 != uVar13) || (*piVar12 == 0x22)) {
            std::__throw_out_of_range("stoi");
          }
          if (*piVar12 == 0) {
            *piVar12 = iVar2;
          }
          if (local_218 !=
              (undefined1  [8])
              &applier.
               super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
               .super_Pass.runner) {
            operator_delete((void *)local_218,
                            (ulong)((long)&(applier.
                                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                            .super_Pass.runner)->_vptr_PassRunner + 1));
          }
          if (auStack_78._0_4_ != Array) goto LAB_00a4c842;
          uVar13 = uVar13 & 0xffffffff;
          defaultValue = *(string **)wtf8.super_IString.str._M_len;
          if ((ulong)(*(long *)(wtf8.super_IString.str._M_len + 8) - (long)defaultValue >> 4) <=
              uVar13) {
            Fatal::Fatal((Fatal *)local_218);
            Fatal::operator<<((Fatal *)local_218,
                              (char (*) [49])"StringLifting: bad index in string.const section");
            goto LAB_00a4cbba;
          }
          piVar12 = (int *)(&defaultValue->_M_dataplus)[uVar13 * 2]._M_p;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (&defaultValue->_M_string_length)[uVar13 * 2];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (*piVar12 != 0) {
            Fatal::Fatal((Fatal *)local_218);
            Fatal::operator<<((Fatal *)local_218,
                              (char (*) [58])
                              "StringLifting: string.const section entry is not a string");
            goto LAB_00a4cbba;
          }
          sVar14 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::count(&(this->importedStrings)._M_h,
                           (key_type *)
                           (puVar20->_M_t).
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          if (sVar14 != 0) {
            Fatal::Fatal((Fatal *)local_218);
            Fatal::operator<<((Fatal *)local_218,
                              (char (*) [57])
                              "StringLifting: string.const section tramples other const");
            goto LAB_00a4cbba;
          }
          if (*piVar12 != 0) {
            __assert_fail("isString()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                          ,0xc2,"IString &json::Value::getIString()");
          }
          sVar6 = *(size_t *)(piVar12 + 2);
          pcVar5 = *(char **)(piVar12 + 4);
          pmVar15 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->importedStrings,
                                 (key_type *)
                                 (puVar20->_M_t).
                                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                 .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          (pmVar15->super_IString).str._M_len = sVar6;
          (pmVar15->super_IString).str._M_str = pcVar5;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar3);
    }
    iVar17._M_current = local_80._M_current;
    std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::_M_erase
              (&module->customSections,local_80);
    json::Value::free((Value *)auStack_78,iVar17._M_current);
    if (local_408 != (undefined1  [8])0x0) {
      operator_delete((void *)local_408,
                      (long)copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)local_408);
    }
  }
  local_420.element.type.id = 2;
  local_420.element.packedType = i16;
  local_420.element.mutable_ = Mutable;
  HeapType::HeapType(&local_410,&local_420);
  if (((uint)(0x7c < local_410.id) * 4 + 3 & (uint)local_410.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  puVar21 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar22 = local_84;
  if (puVar21 != puVar7) {
    local_220 = (CustomSection *)&this->substringImport;
    local_228 = (CustomSection *)&this->charCodeAtImport;
    local_230 = (CustomSection *)&this->lengthImport;
    local_238 = (CustomSection *)&this->compareImport;
    local_240 = (CustomSection *)&this->equalsImport;
    local_248 = (CustomSection *)&this->intoCharCodeArrayImport;
    local_80._M_current = (CustomSection *)&this->concatImport;
    do {
      pFVar8 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar5 = *(char **)((long)&(pFVar8->super_Importable).module + 8);
      if ((pcVar5 != (char *)0x0) && (pcVar18 = (char *)&WasmStringsModule, pcVar5 == DAT_010b18e8))
      {
        _local_408 = HeapType::getSignature(&pFVar8->type);
        pFVar8 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        sVar27 = IString::interned((IString *)0x11,(string_view)ZEXT816(0xe04675),SUB81(pcVar18,0));
        if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
          applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass._vptr_Pass = (_func_int **)0x2;
          applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass.runner = (PassRunner *)0x2;
          types._M_len = 3;
          types._M_array = (iterator)local_218;
          local_218 = (undefined1  [8])(local_410.id | 2);
          wasm::Type::Type(&local_280,types);
          if ((local_408 != (undefined1  [8])local_280.id) ||
             (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start != &DAT_00000008)) {
            Fatal::Fatal((Fatal *)local_218);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass.runner,"StringLifting: bad signature for fromCharCodeArray: ",
                       0x34);
            Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
            goto LAB_00a4cbba;
          }
          pFVar8 = (puVar21->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
          uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
          uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
          uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
          iVar17._M_current = (CustomSection *)&this->fromCharCodeArrayImport;
        }
        else {
          pFVar8 = (puVar21->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          sVar27 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xe046bc),SUB81(pcVar18,0))
          ;
          if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
            if ((local_408 != (undefined1  [8])0x2) ||
               (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start != &DAT_00000008)) {
              Fatal::Fatal((Fatal *)local_218);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_Pass.runner,"StringLifting: bad signature for fromCodePoint: ",0x30
                        );
              Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
              goto LAB_00a4cbba;
            }
            pFVar8 = (puVar21->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
            uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
            uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
            uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
            iVar17._M_current = (CustomSection *)&this->fromCodePointImport;
          }
          else {
            pFVar8 = (puVar21->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            sVar27 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe02b42),
                                       SUB81(pcVar18,0));
            if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
              local_218 = (undefined1  [8])0xa;
              applier.
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
              .super_Pass._vptr_Pass = (_func_int **)0xa;
              types_00._M_len = 2;
              types_00._M_array = (iterator)local_218;
              wasm::Type::Type(&local_278,types_00);
              if ((local_408 != (undefined1  [8])local_278.id) ||
                 (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != &DAT_00000008)) {
                Fatal::Fatal((Fatal *)local_218);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           &applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_Pass.runner,"StringLifting: bad signature for concta: ",0x29);
                Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                goto LAB_00a4cbba;
              }
              pFVar8 = (puVar21->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
              uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
              uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
              uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
              iVar17._M_current = local_80._M_current;
            }
            else {
              pFVar8 = (puVar21->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              sVar27 = IString::interned((IString *)0x11,(string_view)ZEXT816(0xe04725),
                                         SUB81(pcVar18,0));
              if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
                local_218 = (undefined1  [8])0xa;
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass.runner = (PassRunner *)0x2;
                types_01._M_len = 3;
                types_01._M_array = (iterator)local_218;
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass._vptr_Pass = (_func_int **)(local_410.id | 2);
                wasm::Type::Type(&local_270,types_01);
                if ((local_408 != (undefined1  [8])local_270.id) ||
                   (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x2)) {
                  Fatal::Fatal((Fatal *)local_218);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             &applier.
                              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                              .super_Pass.runner,
                             "StringLifting: bad signature for intoCharCodeArray: ",0x34);
                  Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                  goto LAB_00a4cbba;
                }
                pFVar8 = (puVar21->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
                iVar17._M_current = local_248;
              }
              else {
                pFVar8 = (puVar21->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                sVar27 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe0476c),
                                           SUB81(pcVar18,0));
                if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
                  local_218 = (undefined1  [8])0xa;
                  applier.
                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                  .super_Pass._vptr_Pass = (_func_int **)0xa;
                  types_02._M_len = 2;
                  types_02._M_array = (iterator)local_218;
                  wasm::Type::Type(&local_268,types_02);
                  if ((local_408 != (undefined1  [8])local_268.id) ||
                     (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x2)) {
                    Fatal::Fatal((Fatal *)local_218);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               &applier.
                                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                .super_Pass.runner,"StringLifting: bad signature for equals: ",0x29)
                    ;
                    Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                    goto LAB_00a4cbba;
                  }
                  pFVar8 = (puVar21->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                  uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                  uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                  uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
                  iVar17._M_current = local_240;
                }
                else {
                  pFVar8 = (puVar21->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  sVar27 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe02b5a),
                                             SUB81(pcVar18,0));
                  if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
                    local_218 = (undefined1  [8])0xa;
                    applier.
                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    .super_Pass._vptr_Pass = (_func_int **)0xa;
                    types_03._M_len = 2;
                    types_03._M_array = (iterator)local_218;
                    wasm::Type::Type(&local_260,types_03);
                    if ((local_408 != (undefined1  [8])local_260.id) ||
                       (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x2)) {
                      Fatal::Fatal((Fatal *)local_218);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 &applier.
                                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                  .super_Pass.runner,"StringLifting: bad signature for compare: ",
                                 0x2a);
                      Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                      goto LAB_00a4cbba;
                    }
                    pFVar8 = (puVar21->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                    uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                    uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                    uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
                    iVar17._M_current = local_238;
                  }
                  else {
                    pFVar8 = (puVar21->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    sVar27 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe566ab),
                                               SUB81(pcVar18,0));
                    if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
                      if ((local_408 != (undefined1  [8])0xa) ||
                         (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x2)) {
                        Fatal::Fatal((Fatal *)local_218);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &applier.
                                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                    .super_Pass.runner,"StringLifting: bad signature for length: ",
                                   0x29);
                        Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                        goto LAB_00a4cbba;
                      }
                      pFVar8 = (puVar21->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                      uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                      uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                      uVar26 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 0xc);
                      iVar17._M_current = local_230;
                    }
                    else {
                      pFVar8 = (puVar21->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      sVar27 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe047f2),
                                                 SUB81(pcVar18,0));
                      if (*(char **)((long)&(pFVar8->super_Importable).base + 8) == sVar27._M_str) {
                        local_218 = (undefined1  [8])0xa;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass._vptr_Pass = (_func_int **)0x2;
                        types_04._M_len = 2;
                        types_04._M_array = (iterator)local_218;
                        wasm::Type::Type(&local_258,types_04);
                        if ((local_408 != (undefined1  [8])local_258.id) ||
                           (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x2)) {
                          Fatal::Fatal((Fatal *)local_218);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &applier.
                                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                      .super_Pass.runner,
                                     "StringLifting: bad signature for charCodeAt: ",0x2d);
                          Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                          goto LAB_00a4cbba;
                        }
                        pFVar8 = (puVar21->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                        uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                        uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                        uVar26 = *(undefined4 *)
                                  ((long)&(pFVar8->super_Importable).super_Named + 0xc);
                        iVar17._M_current = local_228;
                      }
                      else {
                        pFVar8 = (puVar21->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        sVar27 = IString::interned((IString *)&DAT_00000009,
                                                   (string_view)ZEXT816(0xe0482b),SUB81(pcVar18,0));
                        if (*(char **)((long)&(pFVar8->super_Importable).base + 8) != sVar27._M_str)
                        {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"warning: unknown strings import: ",0x21)
                          ;
                          pFVar8 = (puVar21->_M_t).
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                          name.super_IString.str._M_str = pcVar18;
                          name.super_IString.str._M_len =
                               (size_t)*(char **)((long)&(pFVar8->super_Importable).base + 8);
                          poVar16 = wasm::operator<<((wasm *)&std::cerr,
                                                     *(ostream **)
                                                      &(pFVar8->super_Importable).base.super_IString
                                                       .str,name);
                          local_218[0] = 10;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_218,1);
                          goto LAB_00a4c6c3;
                        }
                        local_218 = (undefined1  [8])0xa;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass._vptr_Pass = (_func_int **)0x2;
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass.runner = (PassRunner *)0x2;
                        types_05._M_len = 3;
                        types_05._M_array = (iterator)local_218;
                        wasm::Type::Type(&local_250,types_05);
                        if ((local_408 != (undefined1  [8])local_250.id) ||
                           (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start != &DAT_00000008)) {
                          Fatal::Fatal((Fatal *)local_218);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &applier.
                                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                      .super_Pass.runner,
                                     "StringLifting: bad signature for substring: ",0x2c);
                          Fatal::operator<<((Fatal *)local_218,(Signature *)local_408);
                          goto LAB_00a4cbba;
                        }
                        pFVar8 = (puVar21->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        uVar23 = *(undefined4 *)&(pFVar8->super_Importable).super_Named;
                        uVar24 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 4);
                        uVar25 = *(undefined4 *)((long)&(pFVar8->super_Importable).super_Named + 8);
                        uVar26 = *(undefined4 *)
                                  ((long)&(pFVar8->super_Importable).super_Named + 0xc);
                        iVar17._M_current = local_220;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        *(undefined4 *)&((iVar17._M_current)->name)._M_dataplus._M_p = uVar23;
        *(undefined4 *)((long)&((iVar17._M_current)->name)._M_dataplus._M_p + 4) = uVar24;
        *(undefined4 *)&((iVar17._M_current)->name)._M_string_length = uVar25;
        *(undefined4 *)((long)&((iVar17._M_current)->name)._M_string_length + 4) = uVar26;
        uVar22 = 1;
      }
LAB_00a4c6c3:
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar7);
  }
  if ((uVar22 & 1) != 0) {
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.runner =
         (PassRunner *)
         &applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass.name._M_string_length;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass._vptr_Pass = (_func_int **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.name._M_string_length._0_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.replacep = (Expression **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed._M_elems[9].currp =
         (Expression **)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.currFunction = (Function *)0x0;
    local_218 = (undefined1  [8])&PTR__WalkerPass_01074ea8;
    applier.parent._0_1_ = 0;
    applier.super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
    super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
    super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.currModule = (Module *)this;
    WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_> *)
               local_218,(this->super_Pass).runner,module);
    Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::walkModuleCode
              ((Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *)
               ((long)&applier.
                       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                       .super_Pass.passArg.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               + 0x20),module);
    pbVar1 = (byte *)((long)&(module->features).features + 1);
    *pbVar1 = *pbVar1 | 0x40;
    if (applier.
        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
        super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
        super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                      super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.fixed.
                      _M_elems[9].currp,
                      (long)applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                            super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task,_std::allocator<wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)applier.
                            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                            .super_PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.
                            super_Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>.stack.
                            fixed._M_elems[9].currp);
    }
    Pass::~Pass((Pass *)local_218);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // Whether we found any work to do.
    bool found = false;

    // Imported string constants look like
    //
    //   (import "\'" "bar" (global $string.bar.internal.name (ref extern)))
    //
    // That is, they are imported from module "'" and the basename is the
    // actual string. Find them all so we can apply them.
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    for (auto& global : module->globals) {
      if (!global->imported()) {
        continue;
      }
      if (global->module == stringConstsModule) {
        // Encode from WTF-8 to WTF-16.
        auto wtf8 = global->base;
        std::stringstream wtf16;
        bool valid = String::convertWTF8ToWTF16(wtf16, wtf8.str);
        if (!valid) {
          Fatal() << "Bad string to lift: " << wtf8;
        }
        importedStrings[global->name] = wtf16.str();
        found = true;
      }
    }

    // Imported strings may also be found in the string section.
    auto stringSectionIter = std::find_if(
      module->customSections.begin(),
      module->customSections.end(),
      [&](CustomSection& section) { return section.name == "string.consts"; });
    if (stringSectionIter != module->customSections.end()) {
      // We found the string consts section. Parse it.
      auto& section = *stringSectionIter;
      auto copy = section.data;
      json::Value array;
      array.parse(copy.data(), json::Value::WTF16);
      if (!array.isArray()) {
        Fatal() << "StringLifting: string.const section should be a JSON array";
      }

      // We have the array of constants from the section. Find globals that
      // refer to it.
      for (auto& global : module->globals) {
        if (!global->imported() || global->module != "string.const") {
          continue;
        }
        // The index in the array is the basename.
        Index index = std::stoi(std::string(global->base.str));
        if (index >= array.size()) {
          Fatal() << "StringLifting: bad index in string.const section";
        }
        auto item = array[index];
        if (!item->isString()) {
          Fatal()
            << "StringLifting: string.const section entry is not a string";
        }
        if (importedStrings.count(global->name)) {
          Fatal() << "StringLifting: string.const section tramples other const";
        }
        importedStrings[global->name] = item->getIString();
      }

      // Remove the custom section: After lifting it has no purpose (and could
      // cause problems with repeated lifting/lowering).
      module->customSections.erase(stringSectionIter);
    }

    auto array16 = Type(Array(Field(Field::i16, Mutable)), Nullable);
    auto refExtern = Type(HeapType::ext, NonNullable);
    auto externref = Type(HeapType::ext, Nullable);
    auto i32 = Type::i32;

    // Find imported string functions.
    for (auto& func : module->functions) {
      if (!func->imported() || func->module != WasmStringsModule) {
        continue;
      }
      auto sig = func->type.getSignature();
      if (func->base == "fromCharCodeArray") {
        if (sig != Signature({array16, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCharCodeArray: "
                  << sig;
        }
        fromCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "fromCodePoint") {
        if (sig != Signature(i32, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCodePoint: " << sig;
        }
        fromCodePointImport = func->name;
        found = true;
      } else if (func->base == "concat") {
        if (sig != Signature({externref, externref}, refExtern)) {
          Fatal() << "StringLifting: bad signature for concta: " << sig;
        }
        concatImport = func->name;
        found = true;
      } else if (func->base == "intoCharCodeArray") {
        if (sig != Signature({externref, array16, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for intoCharCodeArray: "
                  << sig;
        }
        intoCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "equals") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for equals: " << sig;
        }
        equalsImport = func->name;
        found = true;
      } else if (func->base == "compare") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for compare: " << sig;
        }
        compareImport = func->name;
        found = true;
      } else if (func->base == "length") {
        if (sig != Signature({externref}, i32)) {
          Fatal() << "StringLifting: bad signature for length: " << sig;
        }
        lengthImport = func->name;
        found = true;
      } else if (func->base == "charCodeAt") {
        if (sig != Signature({externref, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for charCodeAt: " << sig;
        }
        charCodeAtImport = func->name;
        found = true;
      } else if (func->base == "substring") {
        if (sig != Signature({externref, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for substring: " << sig;
        }
        substringImport = func->name;
        found = true;
      } else {
        std::cerr << "warning: unknown strings import: " << func->base << '\n';
      }
    }

    if (!found) {
      // Nothing to do.
      return;
    }

    struct StringApplier : public WalkerPass<PostWalker<StringApplier>> {
      bool isFunctionParallel() override { return true; }

      const StringLifting& parent;

      StringApplier(const StringLifting& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }

      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        // Replace global.gets of imported strings with string.const.
        auto iter = parent.importedStrings.find(curr->name);
        if (iter != parent.importedStrings.end()) {
          auto wtf16 = iter->second;
          replaceCurrent(Builder(*getModule()).makeStringConst(wtf16.str));
          modified = true;
        }
      }

      void visitCall(Call* curr) {
        // Replace calls of imported string methods with stringref operations.
        if (curr->target == parent.fromCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringNew(StringNewWTF16Array,
                                          curr->operands[0],
                                          curr->operands[1],
                                          curr->operands[2]));
        } else if (curr->target == parent.fromCodePointImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringNew(StringNewFromCodePoint, curr->operands[0]));
        } else if (curr->target == parent.concatImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringConcat(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.intoCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEncode(StringEncodeWTF16Array,
                                             curr->operands[0],
                                             curr->operands[1],
                                             curr->operands[2]));
        } else if (curr->target == parent.equalsImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqEqual,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.compareImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqCompare,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.lengthImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringMeasure(StringMeasureWTF16, curr->operands[0]));
        } else if (curr->target == parent.charCodeAtImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringWTF16Get(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.substringImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringSliceWTF(curr->operands[0],
                                               curr->operands[1],
                                               curr->operands[2]));
        }
      }

      void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }
    };

    StringApplier applier(*this);
    applier.run(getPassRunner(), module);
    applier.walkModuleCode(module);

    // TODO: Add casts. We generate new string.* instructions, and all their
    //       string inputs should be stringref, not externref, but we have not
    //       converted all externrefs to stringrefs (since some externrefs might
    //       be something else). It is not urgent to fix this as the validator
    //       accepts externrefs there atm, and since toolchains will lower
    //       strings out at the end anyhow (which would remove such casts). Note
    //       that if we add a type import for stringref then this problem would
    //       become a lot simpler (we'd convert that type to stringref).

    // Enable the feature so the module validates.
    module->features.enable(FeatureSet::Strings);
  }